

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

lws * lws_wsi_mux_move_child_to_tail(lws **wsi2)

{
  lws *plVar1;
  lws_log_cx_t *cx;
  char *pcVar2;
  lws *obj;
  
  plVar1 = *wsi2;
  do {
    obj = plVar1;
    if (obj == (lws *)0x0) {
      return (lws *)0x0;
    }
    plVar1 = (obj->mux).sibling_list;
  } while (plVar1 != (lws *)0x0);
  cx = (obj->lc).log_cx;
  pcVar2 = lws_wsi_tag(*wsi2);
  _lws_log_cx(cx,lws_log_prepend_wsi,obj,0x10,"lws_wsi_mux_move_child_to_tail","*wsi2 = %s\n",pcVar2
             );
  if (obj != *wsi2) {
    (obj->mux).sibling_list = *wsi2;
    *wsi2 = ((*wsi2)->mux).sibling_list;
    (((obj->mux).sibling_list)->mux).sibling_list = (lws *)0x0;
    obj = (obj->mux).sibling_list;
    if (obj == (lws *)0x0) {
      return (lws *)0x0;
    }
  }
  (obj->mux).requested_POLLOUT = '\0';
  return obj;
}

Assistant:

struct lws *
lws_wsi_mux_move_child_to_tail(struct lws **wsi2)
{
	struct lws *w = *wsi2;

	while (w) {
		if (!w->mux.sibling_list) { /* w is the current last */
			lwsl_wsi_debug(w, "*wsi2 = %s\n", lws_wsi_tag(*wsi2));

			if (w == *wsi2) /* we are already last */
				break;

			/* last points to us as new last */
			w->mux.sibling_list = *wsi2;

			/* guy pointing to us until now points to
			 * our old next */
			*wsi2 = (*wsi2)->mux.sibling_list;

			/* we point to nothing because we are last */
			w->mux.sibling_list->mux.sibling_list = NULL;

			/* w becomes us */
			w = w->mux.sibling_list;
			break;
		}
		w = w->mux.sibling_list;
	}

	/* clear the waiting for POLLOUT on the guy that was chosen */

	if (w)
		w->mux.requested_POLLOUT = 0;

	return w;
}